

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stretch.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  allocator local_1ba;
  allocator local_1b9;
  string local_1b8;
  double local_198;
  double local_190;
  string local_188;
  MidiFile midifile;
  Options options;
  
  smf::Options::Options(&options);
  std::__cxx11::string::string
            ((string *)&midifile,"b|bars|m|measures=d:1.0",(allocator *)&local_188);
  std::__cxx11::string::string
            ((string *)&local_1b8,
             "Stretch width of bars (measures) by factor specified (WITHOUT affecting tempo)",
             &local_1ba);
  smf::Options::define(&options,(string *)&midifile,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&midifile);
  std::__cxx11::string::string
            ((string *)&midifile,"d|duration|t|tempo=d:1.0",(allocator *)&local_188);
  std::__cxx11::string::string
            ((string *)&local_1b8,"Stretch duration of track(s) by factor specified",&local_1ba);
  smf::Options::define(&options,(string *)&midifile,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&midifile);
  __nbytes = 1;
  smf::Options::process(&options,argc,argv,1,0);
  iVar2 = smf::Options::getArgCount(&options);
  if (iVar2 == 2) {
    smf::MidiFile::MidiFile(&midifile);
    psVar3 = smf::Options::getArg_abi_cxx11_(&options,1);
    smf::MidiFile::read(&midifile,(int)psVar3,__buf,__nbytes);
    bVar1 = smf::MidiFile::status(&midifile);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error reading MIDI file ");
      psVar3 = smf::Options::getArg_abi_cxx11_(&options,1);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00110a2b;
    }
    std::__cxx11::string::string((string *)&local_1b8,"bars",&local_1ba);
    bVar1 = smf::Options::getBoolean(&options,&local_1b8);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    else {
      std::__cxx11::string::string((string *)&local_188,"duration",&local_1b9);
      bVar1 = smf::Options::getBoolean(&options,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1b8);
      if (!bVar1) goto LAB_00110988;
    }
    std::__cxx11::string::string((string *)&local_1b8,"bars",(allocator *)&local_188);
    local_190 = smf::Options::getDouble(&options,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::string((string *)&local_1b8,"duration",(allocator *)&local_188);
    local_198 = smf::Options::getDouble(&options,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    if ((((local_198 <= 10.0) && (0.1 <= local_190)) && (local_190 <= 10.0)) && (0.1 <= local_198))
    {
      doStretch(&midifile,local_190,local_198);
LAB_00110988:
      psVar3 = smf::Options::getArg_abi_cxx11_(&options,2);
      smf::MidiFile::write(&midifile,(int)psVar3,__buf_00,__nbytes);
      smf::MidiFile::~MidiFile(&midifile);
      smf::Options::~Options(&options);
      return 0;
    }
    std::operator<<((ostream *)&std::cerr,"stretch parameters must be between 0.1 and 10.\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"two MIDI filenames are required.\n");
  }
LAB_00110a2b:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
   Options options;
   options.define("b|bars|m|measures=d:1.0", 
      "Stretch width of bars (measures) by factor specified (WITHOUT affecting tempo)");
   options.define("d|duration|t|tempo=d:1.0",
      "Stretch duration of track(s) by factor specified");
   options.process(argc, argv);
   if (options.getArgCount() != 2) {
      cerr << "two MIDI filenames are required.\n";
      exit(1);
   }

   MidiFile midifile;
   midifile.read(options.getArg(1));
   if (!midifile.status()) {
      cerr << "Error reading MIDI file " << options.getArg(1) << endl;
      exit(1);
   }

   if (options.getBoolean("bars") || options.getBoolean("duration")) {
      double bars = options.getDouble("bars");
      double duration = options.getDouble("duration");
      if (bars < 0.1 || bars > 10.0 || duration < 0.1 || duration > 10.0) {
	  cerr << "stretch parameters must be between 0.1 and 10.\n";
	  exit(1);
      }
      doStretch(midifile, bars, duration);
   }

   midifile.write(options.getArg(2));
   return 0;
}